

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-lexer.cc
# Opt level: O1

Token * __thiscall wabt::WastLexer::GetIdToken(Token *__return_storage_ptr__,WastLexer *this)

{
  byte *pbVar1;
  int iVar2;
  byte *pbVar3;
  long lVar4;
  
  pbVar1 = (byte *)this->buffer_end_;
  if (this->cursor_ < pbVar1) {
    this->cursor_ = this->cursor_ + 1;
  }
  pbVar3 = (byte *)this->cursor_;
  iVar2 = 0;
  while( true ) {
    if (pbVar3 < pbVar1) {
      lVar4 = (ulong)*pbVar3 + 1;
    }
    else {
      lVar4 = 0;
    }
    if ((""[lVar4] & 1U) == 0) break;
    if (pbVar3 < pbVar1) {
      pbVar3 = pbVar3 + 1;
      this->cursor_ = (char *)pbVar3;
    }
    iVar2 = iVar2 + -1;
  }
  TextToken(__return_storage_ptr__,this,(uint)(iVar2 != 0) * 2 + Reserved,0);
  return __return_storage_ptr__;
}

Assistant:

Token WastLexer::GetIdToken() {
  ReadChar();
  if (NoTrailingReservedChars()) {
    return TextToken(TokenType::Reserved);
  }
  return TextToken(TokenType::Var);
}